

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>
* __thiscall
kj::
mvCapture<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::__0,kj::Array<capnp::PipelineOp>&>
          (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>
           *__return_storage_ptr__,kj *this,Array<capnp::PipelineOp> *param,Type *func)

{
  Type *func_00;
  Array<capnp::PipelineOp> *param_00;
  Type *func_local;
  Array<capnp::PipelineOp> *param_local;
  
  func_00 = fwd<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::__0>
                      ((NoInfer<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9)>
                        *)param);
  param_00 = mv<kj::Array<capnp::PipelineOp>>((Array<capnp::PipelineOp> *)this);
  CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:411:9),_kj::Array<capnp::PipelineOp>_>
  ::CaptureByMove(__return_storage_ptr__,func_00,param_00);
  return __return_storage_ptr__;
}

Assistant:

inline CaptureByMove<Func, Decay<MovedParam>> mvCapture(MovedParam&& param, Func&& func) {
  // Hack to create a "lambda" which captures a variable by moving it rather than copying or
  // referencing.  C++14 generalized captures should make this obsolete, but for now in C++11 this
  // is commonly needed for Promise continuations that own their state.  Example usage:
  //
  //    Own<Foo> ptr = makeFoo();
  //    Promise<int> promise = callRpc();
  //    promise.then(mvCapture(ptr, [](Own<Foo>&& ptr, int result) {
  //      return ptr->finish(result);
  //    }));

  return CaptureByMove<Func, Decay<MovedParam>>(kj::fwd<Func>(func), kj::mv(param));
}